

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O1

void __thiscall buffer::reserve(buffer *this,int count)

{
  char *__ptr;
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  __ptr = this->buffer_;
  pcVar1 = this->begin_;
  iVar5 = this->capacity_;
  if ((long)(__ptr + ((long)iVar5 - (long)pcVar1)) <= (long)count) {
    if (count < this->init_size_) {
      count = this->init_size_;
    }
    iVar3 = 0x2000;
    if (0x2000 < iVar5) {
      iVar3 = this->capacity_;
    }
    uVar6 = (long)this->end_ - (long)pcVar1;
    do {
      iVar4 = iVar3;
      iVar3 = iVar4 * 2;
    } while (iVar4 < count);
    if (iVar5 < iVar4) {
      pcVar2 = (char *)realloc(__ptr,(long)iVar4);
      this->buffer_ = pcVar2;
      this->capacity_ = iVar4;
    }
    iVar5 = (int)uVar6;
    if ((0 < (int)((long)pcVar1 - (long)__ptr)) && (0 < iVar5)) {
      memmove(this->buffer_,this->buffer_ + ((long)pcVar1 - (long)__ptr & 0x7fffffff),
              uVar6 & 0x7fffffff);
    }
    this->begin_ = this->buffer_;
    this->end_ = this->buffer_ + iVar5;
  }
  return;
}

Assistant:

void buffer::reserve(int count)
{
    if (buffer_ + capacity_ - begin_ > count)
    {
        return;
    }

    int used = end_ - begin_;
    int bias = begin_ - buffer_; 

    count = std::max<int>(count, init_size_);
    int capacity = std::max<int>(min_buffer_size, capacity_);
    while (capacity < count) capacity *= 2;
        
    if (capacity_ < capacity)
    {
        buffer_ = (char*)realloc(buffer_, capacity);
        capacity_ = capacity;
    }

    if (used > 0 && bias > 0)
    {
        memmove(buffer_, buffer_ + bias, used);
    }

    begin_ = buffer_;
    end_ = begin_ + used;
}